

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[5],int,char_const(&)[8],int_const&,char_const(&)[4]>
                   (string *__return_storage_ptr__,char (*arg) [5],int *args,char (*args_1) [8],
                   int *args_2,char (*args_3) [4])

{
  string sStack_68;
  string local_48;
  
  StringBuilder_abi_cxx11_(&local_48,*arg);
  StringBuilder<int,char_const(&)[8],int_const&,char_const(&)[4]>
            (&sStack_68,args,args_1,args_2,args_3);
  std::operator+(__return_storage_ptr__,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}